

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_three_reg_same_extra(DisasContext_conflict1 *s,uint32_t insn)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  uint rd;
  int line;
  uint rm;
  code *pcVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = insn >> 0xb & 0xf;
  uVar3 = (insn & 0x20000000) >> 0x19;
  if (0x1e < (uVar3 | uVar6)) goto switchD_00634260_caseD_0;
  uVar5 = insn >> 0x16 & 3;
  if ((0x5f000000U >> (uVar3 | uVar6) & 1) == 0) {
    if ((0x30000U >> (uVar3 | uVar6) & 1) == 0) {
      if (((0x40004U >> (uVar3 | uVar6) & 1) == 0) || (uVar5 != 2)) goto switchD_00634260_caseD_0;
      bVar1 = *(byte *)((long)&s->isar->id_aa64isar0 + 5);
    }
    else {
      if (uVar5 - 3 < 0xfffffffe) goto switchD_00634260_caseD_0;
      bVar1 = *(byte *)((long)&s->isar->id_aa64isar0 + 3);
    }
    bVar1 = bVar1 & 0xf0;
  }
  else {
    switch(uVar5) {
    case 0:
      goto switchD_00634260_caseD_0;
    case 1:
      if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) goto switchD_00634260_caseD_0;
      break;
    case 3:
      if ((insn >> 0x1e & 1) == 0) goto switchD_00634260_caseD_0;
    }
    bVar1 = *(byte *)((long)&s->isar->id_aa64isar1 + 2) & 0xf;
  }
  if (bVar1 == 0) {
switchD_00634260_caseD_0:
    unallocated_encoding_aarch64(s);
    return;
  }
  _Var2 = fp_access_check(s);
  if (!_Var2) {
    return;
  }
  if (0xe < uVar6) {
switchD_00634311_caseD_3:
    line = 0x2f60;
LAB_006344a9:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,line,(char *)0x0);
  }
  rd = insn & 0x1f;
  uVar3 = insn >> 5 & 0x1f;
  rm = insn >> 0x10 & 0x1f;
  bVar1 = (byte)(insn >> 0x18);
  switch(uVar6) {
  case 0:
    if (uVar5 == 2) {
      _Var2 = (_Bool)(bVar1 >> 6 & 1);
      pcVar4 = gen_helper_gvec_qrdmlah_s32;
      goto LAB_00634469;
    }
    if (uVar5 == 1) {
      _Var2 = (_Bool)(bVar1 >> 6 & 1);
      pcVar4 = gen_helper_gvec_qrdmlah_s16;
      goto LAB_00634469;
    }
    line = 0x2f1d;
    goto LAB_006344a9;
  case 1:
    if (uVar5 == 2) {
      _Var2 = (_Bool)(bVar1 >> 6 & 1);
      pcVar4 = gen_helper_gvec_qrdmlsh_s32;
    }
    else {
      if (uVar5 != 1) {
        line = 0x2f2a;
        goto LAB_006344a9;
      }
      _Var2 = (_Bool)(bVar1 >> 6 & 1);
      pcVar4 = gen_helper_gvec_qrdmlsh_s16;
    }
LAB_00634469:
    gen_gvec_op3_env(s,_Var2,rd,uVar3,rm,pcVar4);
    return;
  case 2:
    pcVar4 = gen_helper_gvec_udot_b;
    if ((insn & 0x20000000) == 0) {
      pcVar4 = gen_helper_gvec_sdot_b;
    }
    gen_gvec_op3_ool(s,(_Bool)(bVar1 >> 6 & 1),rd,uVar3,rm,0,pcVar4);
    return;
  default:
    goto switchD_00634311_caseD_3;
  case 8:
  case 9:
  case 10:
  case 0xb:
    uVar6 = insn >> 0xb & 3;
    if (uVar5 == 3) {
      pcVar4 = gen_helper_gvec_fcmlad;
    }
    else {
      if (uVar5 != 2) {
        pcVar4 = gen_helper_gvec_fcmlah;
        _Var2 = true;
        break;
      }
      pcVar4 = gen_helper_gvec_fcmlas;
    }
    _Var2 = false;
    break;
  case 0xc:
  case 0xe:
    uVar6 = insn >> 0xc & 1;
    if (uVar5 == 3) {
      pcVar4 = gen_helper_gvec_fcaddd;
    }
    else {
      if (uVar5 != 2) {
        pcVar4 = gen_helper_gvec_fcaddh;
        _Var2 = true;
        break;
      }
      pcVar4 = gen_helper_gvec_fcadds;
    }
    _Var2 = false;
  }
  gen_gvec_op3_fpst(s,(_Bool)(bVar1 >> 6 & 1),rd,uVar3,rm,_Var2,uVar6,pcVar4);
  return;
}

Assistant:

static void disas_simd_three_reg_same_extra(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 4);
    int rm = extract32(insn, 16, 5);
    int size = extract32(insn, 22, 2);
    bool u = extract32(insn, 29, 1);
    bool is_q = extract32(insn, 30, 1);
    bool feature;
    int rot;

    switch (u * 16 + opcode) {
    case 0x10: /* SQRDMLAH (vector) */
    case 0x11: /* SQRDMLSH (vector) */
        if (size != 1 && size != 2) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_rdm, s);
        break;
    case 0x02: /* SDOT (vector) */
    case 0x12: /* UDOT (vector) */
        if (size != MO_32) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_dp, s);
        break;
    case 0x18: /* FCMLA, #0 */
    case 0x19: /* FCMLA, #90 */
    case 0x1a: /* FCMLA, #180 */
    case 0x1b: /* FCMLA, #270 */
    case 0x1c: /* FCADD, #90 */
    case 0x1e: /* FCADD, #270 */
        if (size == 0
            || (size == 1 && !dc_isar_feature(aa64_fp16, s))
            || (size == 3 && !is_q)) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_fcma, s);
        break;
    default:
        unallocated_encoding(s);
        return;
    }
    if (!feature) {
        unallocated_encoding(s);
        return;
    }
    if (!fp_access_check(s)) {
        return;
    }

    switch (opcode) {
    case 0x0: /* SQRDMLAH (vector) */
        switch (size) {
        case 1:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlah_s16);
            break;
        case 2:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlah_s32);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    case 0x1: /* SQRDMLSH (vector) */
        switch (size) {
        case 1:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlsh_s16);
            break;
        case 2:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlsh_s32);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    case 0x2: /* SDOT / UDOT */
        gen_gvec_op3_ool(s, is_q, rd, rn, rm, 0,
                         u ? gen_helper_gvec_udot_b : gen_helper_gvec_sdot_b);
        return;

    case 0x8: /* FCMLA, #0 */
    case 0x9: /* FCMLA, #90 */
    case 0xa: /* FCMLA, #180 */
    case 0xb: /* FCMLA, #270 */
        rot = extract32(opcode, 0, 2);
        switch (size) {
        case 1:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, true, rot,
                              gen_helper_gvec_fcmlah);
            break;
        case 2:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, false, rot,
                              gen_helper_gvec_fcmlas);
            break;
        case 3:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, false, rot,
                              gen_helper_gvec_fcmlad);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    case 0xc: /* FCADD, #90 */
    case 0xe: /* FCADD, #270 */
        rot = extract32(opcode, 1, 1);
        switch (size) {
        case 1:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, size == 1, rot,
                              gen_helper_gvec_fcaddh);
            break;
        case 2:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, size == 1, rot,
                              gen_helper_gvec_fcadds);
            break;
        case 3:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, size == 1, rot,
                              gen_helper_gvec_fcaddd);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    default:
        g_assert_not_reached();
    }
}